

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O2

void __thiscall
cmCTestGlobalVC::WriteXMLDirectory
          (cmCTestGlobalVC *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  _Base_ptr p_Var1;
  string full;
  string local_80;
  cmCTestGlobalVC *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = "/";
  if (path->_M_string_length == 0) {
    local_58 = "";
  }
  local_60 = this;
  std::__cxx11::string::string((string *)&local_80,"Directory",(allocator *)&local_50);
  cmXMLWriter::StartElement(xml,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"Name",(allocator *)&local_50);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_80,path);
  std::__cxx11::string::~string((string *)&local_80);
  for (p_Var1 = (dir->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(dir->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
       )._M_t._M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_50,path,local_58);
    std::operator+(&local_80,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::__cxx11::string::~string((string *)&local_50);
    cmCTestVC::WriteXMLEntry
              (&local_60->super_cmCTestVC,xml,path,(string *)(p_Var1 + 1),&local_80,
               (File *)(p_Var1 + 2));
    std::__cxx11::string::~string((string *)&local_80);
  }
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLDirectory(cmXMLWriter& xml,
                                        std::string const& path,
                                        Directory const& dir)
{
  const char* slash = path.empty()? "":"/";
  xml.StartElement("Directory");
  xml.Element("Name", path);
  for(Directory::const_iterator fi = dir.begin(); fi != dir.end(); ++fi)
    {
    std::string full = path + slash + fi->first;
    this->WriteXMLEntry(xml, path, fi->first, full, fi->second);
    }
  xml.EndElement(); // Directory
}